

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<long>_>::RegularLink(RegularLink<diy::Bounds<long>_> *this)

{
  undefined8 *in_RDI;
  Registrar<diy::RegularLink<diy::Bounds<long>_>_> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffec;
  Bounds<long> *in_stack_fffffffffffffff0;
  
  Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<long>_>_>::Registrar
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR_id_abi_cxx11__001ea808;
  *(undefined4 *)(in_RDI + 4) = 0;
  std::
  map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
  ::map((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         *)0x17bd9b);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x17bdae);
  Bounds<long>::Bounds(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  Bounds<long>::Bounds(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  std::vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>::vector
            ((vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_> *)0x17bdeb);
  std::vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>::vector
            ((vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_> *)0x17bdfc);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x17be0d);
  return;
}

Assistant:

RegularLink():
                  dim_(0), core_(0), bounds_(0)               {}